

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragment(TFileNameDatabase *this,TMndxSearch *pSearch)

{
  uint TableIndex;
  DWORD DVar1;
  TStruct40 *pTVar2;
  bool bVar3;
  DWORD DVar4;
  DWORD TableIndex_00;
  _HASH_ENTRY *p_Var5;
  byte *pbVar6;
  uchar *puVar7;
  DWORD HiBitsIndex;
  DWORD local_44;
  TGenericArray<unsigned_char> *local_40;
  TPathFragmentTable *local_38;
  
  pTVar2 = pSearch->pStruct40;
  p_Var5 = TGenericArray<_HASH_ENTRY>::operator[]
                     (&this->HashTable,
                      (ulong)((pTVar2->NodeIndex << 5 ^ pTVar2->NodeIndex ^
                              (uint)(byte)pSearch->szSearchMask[pTVar2->PathLength]) &
                             this->HashTableMask));
  if (pTVar2->NodeIndex == p_Var5->NodeIndex) {
    TableIndex = (p_Var5->field_2).FragmentOffset;
    if (TableIndex >> 8 < 0xffffff) {
      if (this->pChildDB == (TFileNameDatabase *)0x0) {
        bVar3 = TPathFragmentTable::CompareAndCopyPathFragment
                          (&this->PathFragmentTable,pSearch,(ulong)TableIndex);
      }
      else {
        bVar3 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,TableIndex);
      }
      if (bVar3 == false) goto LAB_001170a0;
    }
    else {
      TGenericArray<char>::Insert(&pTVar2->PathBuffer,(char)TableIndex);
      pTVar2->PathLength = pTVar2->PathLength + 1;
    }
    pTVar2->NodeIndex = p_Var5->NextIndex;
LAB_0011709c:
    bVar3 = true;
  }
  else {
    DVar4 = TSparseArray::GetItem0(&this->CollisionTable,pTVar2->NodeIndex);
    pTVar2->NodeIndex = DVar4 - pTVar2->NodeIndex;
    local_44 = 0xffffffff;
    local_40 = &this->LoBitsTable;
    local_38 = &this->PathFragmentTable;
    while( true ) {
      DVar4 = DVar4 + 1;
      bVar3 = TSparseArray::IsItemPresent(&this->CollisionTable,(ulong)DVar4);
      if (!bVar3) break;
      bVar3 = TSparseArray::IsItemPresent(&this->CollisionHiBitsIndexes,(ulong)pTVar2->NodeIndex);
      if (bVar3) {
        TableIndex_00 = GetPathFragmentOffset2(this,&local_44,pTVar2->NodeIndex);
        DVar1 = pTVar2->PathLength;
        if (this->pChildDB == (TFileNameDatabase *)0x0) {
          bVar3 = TPathFragmentTable::CompareAndCopyPathFragment
                            (local_38,pSearch,(ulong)TableIndex_00);
        }
        else {
          bVar3 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,TableIndex_00);
        }
        if (bVar3 != false) goto LAB_0011709c;
        if (DVar1 != pTVar2->PathLength) break;
      }
      else {
        pbVar6 = TGenericArray<unsigned_char>::operator[](local_40,(ulong)pTVar2->NodeIndex);
        if ((uint)*pbVar6 == (int)pSearch->szSearchMask[pTVar2->PathLength]) {
          puVar7 = TGenericArray<unsigned_char>::operator[](local_40,(ulong)pTVar2->NodeIndex);
          TGenericArray<char>::Insert(&pTVar2->PathBuffer,*puVar7);
          pTVar2->PathLength = pTVar2->PathLength + 1;
          goto LAB_0011709c;
        }
      }
      pTVar2->NodeIndex = pTVar2->NodeIndex + 1;
    }
LAB_001170a0:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;
        DWORD HiBitsIndex;
        DWORD ColTableIndex;
        DWORD TableIndex;
/*
        FILE * fp = fopen("E:\\PathFragmentTable.txt", "wt");
        if (fp != NULL)
        {
            for (DWORD i = 0; i < HashTable.ItemCount; i++)
            {
                FragOffs = HashTable[i].FragOffs;
                fprintf(fp, "%02x ('%c') %08X %08X %08X", i, (0x20 <= i && i < 0x80) ? i : 0x20, HashTable[i].ItemIndex, HashTable[i].NextIndex, FragOffs);

                if(FragOffs != 0x00800000)
                {
                    if((FragOffs & 0xFFFFFF00) == 0xFFFFFF00)
                        fprintf(fp, " '%c'", (char)(FragOffs & 0xFF));
                    else
                        fprintf(fp, " %s", &PathFragmentTable.PathFragments[FragOffs]);
                }
                fprintf(fp, "\n");
            }

            fclose(fp);
        }
*/
        // Calculate the item hash from the current char and fragment ID
        TableIndex = pStruct40->CalcHashValue(pSearch->szSearchMask) & HashTableMask;
        pHashEntry = &HashTable[TableIndex];

        // Does the hash value ID match?
        if(pStruct40->NodeIndex == pHashEntry->NodeIndex)
        {
            // If the higher 24 bits are set, then the fragment is just one letter,
            // contained directly in the table.
            if(!IsPathFragmentSingleChar(pHashEntry))
            {
                // HOTS: 1958B59
                if (pChildDB != NULL)
                {
                    if (!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                        return false;
                }
                else
                {
                    if (!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                        return false;
                }
            }
            else
            {
                // HOTS: 1958B88
                pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                pStruct40->PathLength++;
            }

            // HOTS: 1958BCA
            pStruct40->NodeIndex = pHashEntry->NextIndex;
            return true;
        }

        // HOTS: 1958BE5
        ColTableIndex = CollisionTable.GetItem0(pStruct40->NodeIndex) + 1;
        pStruct40->NodeIndex = (ColTableIndex - pStruct40->NodeIndex - 1);
        HiBitsIndex = CASC_INVALID_INDEX;

        // Keep searching while we have a valid collision table entry
        while(CollisionTable.IsItemPresent(ColTableIndex))
        {
            // If we have high bits in the the bit at NodeIndex is set, it means that there is fragment offset
            // If not, the byte in LoBitsTable is the character
            if(IsPathFragmentString(pStruct40->NodeIndex))
            {
                DWORD FragmentOffset = GetPathFragmentOffset2(HiBitsIndex, pStruct40->NodeIndex);
                DWORD SavePathLength = pStruct40->PathLength;   // HOTS: 1958C62

                // Do we have a child database?
                if(pChildDB != NULL)
                {
                    // HOTS: 1958CCB
                    if(pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                        return true;
                }
                else
                {
                    // HOTS: 1958CD6
                    if(PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                        return true;
                }

                // HOTS: 1958CED
                if(SavePathLength != pStruct40->PathLength)
                    return false;
            }
            else
            {
                // HOTS: 1958CFB
                if(LoBitsTable[pStruct40->NodeIndex] == pSearch->szSearchMask[pStruct40->PathLength])
                {
                    // HOTS: 1958D11
                    pStruct40->PathBuffer.Insert(LoBitsTable[pStruct40->NodeIndex]);
                    pStruct40->PathLength++;
                    return true;
                }
            }

            // HOTS: 1958D11
            pStruct40->NodeIndex++;
            ColTableIndex++;
        }

        return false;
    }